

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmodel.hpp
# Opt level: O2

bool __thiscall QtMWidgets::ListModel<QImage>::removeRows(ListModel<QImage> *this,int row,int count)

{
  long lVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  iVar2 = count + row;
  lVar1 = (((this->d).d)->data).d.size;
  if (iVar2 <= lVar1) {
    iVar3 = 0;
    if (0 < count) {
      iVar3 = count;
    }
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      QList<QImage>::removeAt(&((this->d).d)->data,(long)row);
    }
    AbstractListModel::rowsRemoved(&this->super_AbstractListModel,row,iVar2 + -1);
  }
  return iVar2 <= lVar1;
}

Assistant:

virtual bool removeRows( int row, int count )
	{
		if( row + count > d->data.count() )
			return false;

		for( int i = 0; i < count; ++i )
			d->data.removeAt( row );

		emit rowsRemoved( row, row + count - 1 );

		return true;
	}